

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void linspace(double *x,int N,double xlo,double xhi)

{
  double intv;
  int i;
  double xhi_local;
  double xlo_local;
  int N_local;
  double *x_local;
  
  *x = xlo;
  x[N + -1] = xhi;
  for (intv._4_4_ = 1; intv._4_4_ < N + -1; intv._4_4_ = intv._4_4_ + 1) {
    x[intv._4_4_] = ((xhi - xlo) / (double)(N + -1)) * (double)intv._4_4_ + xlo;
  }
  return;
}

Assistant:

void linspace(double *x, int N,double xlo,double xhi) {
    int i;
    double intv;

    intv = (xhi - xlo)/(double)(N-1);
    x[0] = xlo;
    x[N-1] = xhi;

    for(i = 1; i < N-1;++i) {
        x[i] = xlo + intv * (double) i;
    }
}